

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

ushort __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::AddDisposedObjectFreeBitVector
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,
          SmallHeapBlockBitVector *free)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  FreeObject *this_00;
  ushort uVar6;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->disposedObjectList;
  if (this_00 == (FreeObject *)0x0) {
    return 0;
  }
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  uVar6 = 1;
  do {
    uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressBitIndex(this_00);
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsValidBitIndex
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,(uint)uVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x21f,"(this->IsValidBitIndex(bitIndex))",
                         "this->IsValidBitIndex(bitIndex)");
      if (!bVar3) goto LAB_002aac1d;
      *puVar1 = 0;
    }
    BVar4 = BVStatic<2048UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.debugFreeBits,
                       (uint)uVar5);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x222,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "!this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar3) {
LAB_002aac1d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    BVStatic<2048UL>::Set(free,(uint)uVar5);
    if (this_00 == this->disposedObjectListTail) {
      return uVar6;
    }
    this_00 = FreeObject::GetNext(this_00);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

ushort
SmallFinalizableHeapBlockT<TBlockAttributes>::AddDisposedObjectFreeBitVector(SmallHeapBlockBitVector * free)
{
    // all the finalized object are considered freed, but not allocable yet
    ushort freeCount = 0;
    FreeObject * freeObject = this->disposedObjectList;

    if (freeObject != nullptr)
    {
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));

            // not allocable yet
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));

            // but in the free list to mark can skip scanning the object
            free->Set(bitIndex);
            freeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return freeCount;
}